

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlChar * xmlXPathParseQName(xmlXPathParserContextPtr ctxt,xmlChar **prefix)

{
  xmlChar *pxVar1;
  
  *prefix = (xmlChar *)0x0;
  pxVar1 = xmlXPathParseNCName(ctxt);
  if (pxVar1 == (xmlChar *)0x0) {
    pxVar1 = (xmlChar *)0x0;
  }
  else if (*ctxt->cur == ':') {
    *prefix = pxVar1;
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
    pxVar1 = xmlXPathParseNCName(ctxt);
    return pxVar1;
  }
  return pxVar1;
}

Assistant:

static xmlChar *
xmlXPathParseQName(xmlXPathParserContextPtr ctxt, xmlChar **prefix) {
    xmlChar *ret = NULL;

    *prefix = NULL;
    ret = xmlXPathParseNCName(ctxt);
    if (ret && CUR == ':') {
        *prefix = ret;
	NEXT;
	ret = xmlXPathParseNCName(ctxt);
    }
    return(ret);
}